

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall spdlog::logger::~logger(logger *this)

{
  logger *in_RDI;
  
  ~logger(in_RDI);
  operator_delete(in_RDI,0xd0);
  return;
}

Assistant:

virtual ~logger() = default;